

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

bool __thiscall
re2::Prog::SearchNFA
          (Prog *this,StringPiece *text,StringPiece *context,Anchor anchor,MatchKind kind,
          StringPiece *match,int nmatch)

{
  int nsubmatch;
  bool bVar1;
  StringPiece *submatch;
  StringPiece sp;
  NFA nfa;
  StringPiece local_e8;
  NFA local_d0;
  
  NFA::NFA(&local_d0,this);
  local_e8.data_ = (const_pointer)0x0;
  local_e8.size_ = 0;
  submatch = match;
  if (nmatch == 0) {
    submatch = &local_e8;
  }
  nsubmatch = nmatch + (uint)(nmatch == 0);
  if (kind != kFullMatch) {
    nsubmatch = nmatch;
    submatch = match;
  }
  bVar1 = NFA::Search(&local_d0,text,context,anchor == kAnchored || kind == kFullMatch,
                      kind != kFirstMatch,submatch,nsubmatch);
  if (bVar1) {
    if (kind == kFullMatch) {
      if (nmatch == 0) {
        match = &local_e8;
      }
      if (submatch->data_ + match->size_ != text->data_ + text->size_) goto LAB_001b8eca;
    }
    bVar1 = true;
  }
  else {
LAB_001b8eca:
    bVar1 = false;
  }
  NFA::~NFA(&local_d0);
  return bVar1;
}

Assistant:

bool
Prog::SearchNFA(const StringPiece& text, const StringPiece& context,
                Anchor anchor, MatchKind kind,
                StringPiece* match, int nmatch) {
  if (ExtraDebug)
    Dump();

  NFA nfa(this);
  StringPiece sp;
  if (kind == kFullMatch) {
    anchor = kAnchored;
    if (nmatch == 0) {
      match = &sp;
      nmatch = 1;
    }
  }
  if (!nfa.Search(text, context, anchor == kAnchored, kind != kFirstMatch, match, nmatch))
    return false;
  if (kind == kFullMatch && match[0].end() != text.end())
    return false;
  return true;
}